

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O2

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__argument____gles_texcombiner_argumentRGB_type
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *text_00;
  long lVar1;
  bool bVar2;
  StringHash SVar3;
  long lVar4;
  xmlChar **ppxVar5;
  bool bVar6;
  bool local_42;
  bool local_41;
  argument____gles_texcombiner_argumentRGB_type__AttributeData *local_40;
  ParserTemplateBase *local_38;
  
  local_38 = (ParserTemplateBase *)this;
  local_40 = GeneratedSaxParser::ParserTemplateBase::
             newData<COLLADASaxFWL14::argument____gles_texcombiner_argumentRGB_type__AttributeData>
                       ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar5 = attributes->attributes;
  if (ppxVar5 == (xmlChar **)0x0) {
    bVar6 = true;
  }
  else {
LAB_006d891f:
    do {
      while( true ) {
        while( true ) {
          text = *ppxVar5;
          bVar6 = text == (ParserChar *)0x0;
          if (bVar6) {
            return bVar6;
          }
          SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
          text_00 = ppxVar5[1];
          ppxVar5 = ppxVar5 + 2;
          if (SVar3 != 0x7c504) break;
          local_40->unit = text_00;
        }
        if (SVar3 != 0x66c8834) break;
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_42);
        lVar1 = 0;
        while (lVar4 = lVar1, lVar4 + 0x10 != 0x50) {
          lVar1 = lVar4 + 0x10;
          if (*(StringHash *)((long)&ENUM__gles_texcombiner_operandRGB_enumsMap + lVar4) == SVar3)
          goto code_r0x006d89ae;
        }
        local_42 = true;
        local_40->operand = ENUM__gles_texcombiner_operandRGB_enums__COUNT;
        SVar3 = 0x66c8834;
LAB_006d8a2a:
        bVar6 = GeneratedSaxParser::ParserTemplateBase::handleError
                          (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED,
                           0x8ec3ed4,SVar3,text_00);
        if (bVar6) {
          return false;
        }
      }
      if (SVar3 == 0x7a6c895) {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text_00,&local_41);
        lVar1 = 0;
        do {
          lVar4 = lVar1;
          if (lVar4 + 0x10 == 0x50) {
            local_41 = true;
            local_40->source = ENUM__gles_texcombiner_source_enums__COUNT;
            SVar3 = 0x7a6c895;
            goto LAB_006d8a2a;
          }
          lVar1 = lVar4 + 0x10;
        } while (*(StringHash *)((long)&ENUM__gles_texcombiner_source_enumsMap + lVar4) != SVar3);
        local_40->source = *(ENUM__gles_texcombiner_source_enums *)((long)&DAT_0086c608 + lVar4);
        goto LAB_006d891f;
      }
      bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_38,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0x8ec3ed4,text,
                         text_00);
    } while (!bVar2);
  }
  return bVar6;
code_r0x006d89ae:
  local_40->operand = *(ENUM__gles_texcombiner_operandRGB_enums *)((long)&DAT_0086c648 + lVar4);
  goto LAB_006d891f;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__argument____gles_texcombiner_argumentRGB_type( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__argument____gles_texcombiner_argumentRGB_type( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

argument____gles_texcombiner_argumentRGB_type__AttributeData* attributeData = newData<argument____gles_texcombiner_argumentRGB_type__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_source:
    {
bool failed;
attributeData->source = Utils::toEnum<ENUM__gles_texcombiner_source_enums, StringHash, ENUM__gles_texcombiner_source_enums__COUNT>(attributeValue, failed, ENUM__gles_texcombiner_source_enumsMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_ARGUMENT,
        HASH_ATTRIBUTE_source,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_operand:
    {
bool failed;
attributeData->operand = Utils::toEnum<ENUM__gles_texcombiner_operandRGB_enums, StringHash, ENUM__gles_texcombiner_operandRGB_enums__COUNT>(attributeValue, failed, ENUM__gles_texcombiner_operandRGB_enumsMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_ARGUMENT,
        HASH_ATTRIBUTE_operand,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_unit:
    {

attributeData->unit = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->unit, strlen(attributeData->unit));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_ARGUMENT,
            HASH_ATTRIBUTE_unit,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_ARGUMENT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}